

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O3

bool_t tmDate2(octet *date)

{
  bool_t bVar1;
  bool_t bVar2;
  byte bVar3;
  octet oVar4;
  size_t d;
  size_t m;
  ulong local_20;
  ulong local_18;
  size_t local_10;
  
  bVar1 = tmDate(&local_10,&local_18,&local_20);
  bVar2 = 0;
  if ((bVar1 != 0) && (0xffffffffffffff9b < local_10 - 0x834)) {
    bVar3 = (char)local_10 + 0x30;
    *date = bVar3 / 10;
    date[1] = bVar3 % 10;
    oVar4 = (octet)(local_18 / 10);
    date[2] = oVar4;
    date[3] = (char)local_18 + oVar4 * -10;
    oVar4 = (octet)(local_20 / 10);
    date[4] = oVar4;
    date[5] = (char)local_20 + oVar4 * -10;
    bVar2 = 1;
  }
  return bVar2;
}

Assistant:

bool_t tmDate2(octet date[6])
{
	size_t y;
	size_t m;
	size_t d;
	ASSERT(memIsValid(date, 6));
	// получить дату
	if (!tmDate(&y, &m, &d))
		return FALSE;
	// преобразовать дату
	if (y < 2000 || y > 2099)
		return FALSE;
	y -= 2000;
	date[0] = (octet)(y / 10), date[1] = (octet)(y % 10);
	date[2] = (octet)(m / 10), date[3] = (octet)(m % 10);
	date[4] = (octet)(d / 10), date[5] = (octet)(d % 10);
	return TRUE;
}